

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O2

int secp256k1_bulletproof_inner_product_real_prove_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,secp256k1_ge *out_pt,
              size_t *pt_idx,secp256k1_ge *g,secp256k1_ge *geng,secp256k1_ge *genh,
              secp256k1_scalar *a_arr,secp256k1_scalar *b_arr,secp256k1_scalar *yinv,
              secp256k1_scalar *ux,size_t n,uchar *commit)

{
  size_t sVar1;
  size_t *psVar2;
  int iVar3;
  ulong n_00;
  secp256k1_scalar *psVar4;
  secp256k1_scalar *psVar5;
  secp256k1_ge *r;
  secp256k1_scalar *r_00;
  secp256k1_ge *r_01;
  secp256k1_scalar *r_02;
  size_t sVar6;
  ulong n_01;
  ulong uVar7;
  secp256k1_scalar *r_03;
  bool bVar8;
  secp256k1_scalar *local_a70;
  long local_a58;
  int overflow;
  secp256k1_ge *local_a38;
  size_t *local_a30;
  size_t local_a28;
  secp256k1_ge *local_a20;
  secp256k1_scalar *local_a18;
  secp256k1_scalar *local_a10;
  secp256k1_scalar prod;
  secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
  secp256k1_gej tmprj;
  secp256k1_gej tmplj;
  
  pfdata.yinv.d[0] = yinv->d[0];
  pfdata.yinv.d[1] = yinv->d[1];
  pfdata.yinv.d[2] = yinv->d[2];
  pfdata.yinv.d[3] = yinv->d[3];
  pfdata.genh = genh;
  pfdata.a = a_arr;
  pfdata.b = b_arr;
  pfdata.n = n;
  local_a28 = n + 1;
  local_a10 = b_arr + 1;
  local_a18 = a_arr + 1;
  local_a58 = 0;
  sVar6 = n;
  local_a38 = geng;
  local_a30 = pt_idx;
  local_a20 = g;
  pfdata.geng = geng;
  pfdata.g = g;
  while( true ) {
    psVar2 = local_a30;
    if (sVar6 < 4) {
      return 1;
    }
    pfdata.grouping = (size_t)(uint)(1 << ((byte)local_a58 & 0x1f));
    n_01 = sVar6 >> 1;
    pfdata.g_sc.d[2] = 0;
    pfdata.g_sc.d[3] = 0;
    pfdata.g_sc.d[0] = 0;
    pfdata.g_sc.d[1] = 0;
    psVar4 = a_arr;
    psVar5 = local_a10;
    uVar7 = n_01;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      secp256k1_scalar_mul(&prod,psVar4,psVar5);
      secp256k1_scalar_add(&pfdata.g_sc,&pfdata.g_sc,&prod);
      psVar5 = psVar5 + 2;
      psVar4 = psVar4 + 2;
    }
    secp256k1_scalar_mul(&pfdata.g_sc,&pfdata.g_sc,ux);
    pfdata.yinvn.d[0] = 1;
    pfdata.yinvn.d[1] = 0;
    pfdata.yinvn.d[2] = 0;
    pfdata.yinvn.d[3] = 0;
    secp256k1_ecmult_multi_var
              (ecmult_ctx,scratch,&tmplj,(secp256k1_scalar *)0x0,
               secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l,&pfdata,local_a28);
    sVar1 = *psVar2;
    *psVar2 = sVar1 + 1;
    secp256k1_ge_set_gej(out_pt + sVar1,&tmplj);
    pfdata.g_sc.d[2] = 0;
    pfdata.g_sc.d[3] = 0;
    pfdata.g_sc.d[0] = 0;
    pfdata.g_sc.d[1] = 0;
    psVar4 = b_arr;
    psVar5 = local_a18;
    uVar7 = n_01;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      secp256k1_scalar_mul(&prod,psVar5,psVar4);
      secp256k1_scalar_add(&pfdata.g_sc,&pfdata.g_sc,&prod);
      psVar5 = psVar5 + 2;
      psVar4 = psVar4 + 2;
    }
    secp256k1_scalar_mul(&pfdata.g_sc,&pfdata.g_sc,ux);
    pfdata.yinvn.d[0] = 1;
    pfdata.yinvn.d[1] = 0;
    pfdata.yinvn.d[2] = 0;
    pfdata.yinvn.d[3] = 0;
    secp256k1_ecmult_multi_var
              (ecmult_ctx,scratch,&tmprj,(secp256k1_scalar *)0x0,
               secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r,&pfdata,local_a28);
    sVar1 = *psVar2;
    *psVar2 = sVar1 + 1;
    secp256k1_ge_set_gej(out_pt + sVar1,&tmprj);
    secp256k1_bulletproof_update_commit(commit,out_pt + (*psVar2 - 2),out_pt + (*psVar2 - 1));
    psVar4 = pfdata.x + local_a58;
    secp256k1_scalar_set_b32(psVar4,commit,&overflow);
    if ((overflow != 0) || (iVar3 = secp256k1_scalar_is_zero(psVar4), iVar3 != 0))
    goto LAB_00119935;
    r_02 = pfdata.xinv + local_a58;
    secp256k1_scalar_inverse(r_02,psVar4);
    local_a70 = a_arr;
    psVar5 = a_arr;
    r_00 = b_arr;
    uVar7 = n_01;
    r_03 = b_arr;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      secp256k1_scalar_mul(psVar5,psVar5,psVar4);
      secp256k1_scalar_mul(&prod,psVar5 + 1,r_02);
      secp256k1_scalar_add(local_a70,psVar5,&prod);
      secp256k1_scalar_mul(r_00,r_00,r_02);
      secp256k1_scalar_mul(&prod,r_00 + 1,psVar4);
      secp256k1_scalar_add(r_03,r_00,&prod);
      psVar5 = psVar5 + 2;
      r_00 = r_00 + 2;
      local_a70 = local_a70 + 1;
      r_03 = r_03 + 1;
    }
    if (((0x800 < n && local_a58 == 3) || (0x80 < n && local_a58 == 2)) ||
       (0x20 < n && local_a58 == 1)) break;
    local_a58 = local_a58 + 1;
    sVar6 = n_01;
  }
  n_00 = (ulong)(uint)(2 << ((byte)local_a58 & 0x1f));
  uVar7 = sVar6 >> 1;
  r = genh;
  r_01 = local_a38;
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    secp256k1_ecmult_multi_var
              (ecmult_ctx,scratch,(secp256k1_gej *)&prod,(secp256k1_scalar *)0x0,
               secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g,&pfdata,n_00);
    pfdata.geng = pfdata.geng + n_00;
    secp256k1_ge_set_gej(r_01,(secp256k1_gej *)&prod);
    pfdata.yinvn.d[0] = 1;
    pfdata.yinvn.d[1] = 0;
    pfdata.yinvn.d[2] = 0;
    pfdata.yinvn.d[3] = 0;
    secp256k1_ecmult_multi_var
              (ecmult_ctx,scratch,(secp256k1_gej *)&prod,(secp256k1_scalar *)0x0,
               secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h,&pfdata,n_00);
    pfdata.genh = pfdata.genh + n_00;
    secp256k1_ge_set_gej(r,(secp256k1_gej *)&prod);
    r_01 = r_01 + 1;
    r = r + 1;
  }
  secp256k1_scalar_sqr(&prod,yinv);
  psVar2 = local_a30;
  while (bVar8 = local_a58 != 0, local_a58 = local_a58 + -1, bVar8) {
    secp256k1_scalar_sqr(&prod,&prod);
  }
  iVar3 = secp256k1_bulletproof_inner_product_real_prove_impl
                    (ecmult_ctx,scratch,out_pt,psVar2,local_a20,local_a38,genh,a_arr,b_arr,&prod,ux,
                     n_01,commit);
  if (iVar3 == 0) {
LAB_00119935:
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int secp256k1_bulletproof_inner_product_real_prove_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, secp256k1_ge *out_pt, size_t *pt_idx, const secp256k1_ge *g, secp256k1_ge *geng, secp256k1_ge *genh, secp256k1_scalar *a_arr, secp256k1_scalar *b_arr, const secp256k1_scalar *yinv, const secp256k1_scalar *ux, const size_t n, unsigned char *commit) {
    size_t i;
    size_t halfwidth;

    secp256k1_bulletproof_innerproduct_pf_ecmult_context pfdata;
    pfdata.yinv = *yinv;
    pfdata.g = g;
    pfdata.geng = geng;
    pfdata.genh = genh;
    pfdata.a = a_arr;
    pfdata.b = b_arr;
    pfdata.n = n;

    /* Protocol 1: Iterate, halving vector size until it is 1 */
    for (halfwidth = n / 2, i = 0; halfwidth > IP_AB_SCALARS / 4; halfwidth /= 2, i++) {
        secp256k1_gej tmplj, tmprj;
        size_t j;
        int overflow;

        pfdata.grouping = 1u << i;

        /* L */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j], &b_arr[2*j + 1]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmplj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_l, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmplj);

        /* R */
        secp256k1_scalar_clear(&pfdata.g_sc);
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar prod;
            secp256k1_scalar_mul(&prod, &a_arr[2*j + 1], &b_arr[2*j]);
            secp256k1_scalar_add(&pfdata.g_sc, &pfdata.g_sc, &prod);
        }
        secp256k1_scalar_mul(&pfdata.g_sc, &pfdata.g_sc, ux);

        secp256k1_scalar_set_int(&pfdata.yinvn, 1);
        secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &tmprj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_r, (void *) &pfdata, n + 1);
        secp256k1_ge_set_gej(&out_pt[(*pt_idx)++], &tmprj);

        /* x, x^2, x^-1, x^-2 */
        secp256k1_bulletproof_update_commit(commit, &out_pt[*pt_idx - 2], &out_pt[*pt_idx] - 1);
        secp256k1_scalar_set_b32(&pfdata.x[i], commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&pfdata.x[i])) {
            return 0;
        }
        secp256k1_scalar_inverse_var(&pfdata.xinv[i], &pfdata.x[i]);

        /* update scalar array */
        for (j = 0; j < halfwidth; j++) {
            secp256k1_scalar tmps;
            secp256k1_scalar_mul(&a_arr[2*j], &a_arr[2*j], &pfdata.x[i]);
            secp256k1_scalar_mul(&tmps, &a_arr[2*j + 1], &pfdata.xinv[i]);
            secp256k1_scalar_add(&a_arr[j], &a_arr[2*j], &tmps);

            secp256k1_scalar_mul(&b_arr[2*j], &b_arr[2*j], &pfdata.xinv[i]);
            secp256k1_scalar_mul(&tmps, &b_arr[2*j + 1], &pfdata.x[i]);
            secp256k1_scalar_add(&b_arr[j], &b_arr[2*j], &tmps);

        }

        /* Combine G generators and recurse, if that would be more optimal */
        if ((n > 2048 && i == 3) || (n > 128 && i == 2) || (n > 32 && i == 1)) {
            secp256k1_scalar yinv2;

            for (j = 0; j < halfwidth; j++) {
                secp256k1_gej rj;
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_g, (void *) &pfdata, 2u << i);
                pfdata.geng += 2u << i;
                secp256k1_ge_set_gej(&geng[j], &rj);
                secp256k1_scalar_set_int(&pfdata.yinvn, 1);
                secp256k1_ecmult_multi_var(ecmult_ctx, scratch, &rj, NULL, &secp256k1_bulletproof_innerproduct_pf_ecmult_callback_h, (void *) &pfdata, 2u << i);
                pfdata.genh += 2u << i;
                secp256k1_ge_set_gej(&genh[j], &rj);
            }

            secp256k1_scalar_sqr(&yinv2, yinv);
            for (j = 0; j < i; j++) {
                secp256k1_scalar_sqr(&yinv2, &yinv2);
            }
            if (!secp256k1_bulletproof_inner_product_real_prove_impl(ecmult_ctx, scratch, out_pt, pt_idx, g, geng, genh, a_arr, b_arr, &yinv2, ux, halfwidth, commit)) {
                return 0;
            }
            break;
        }
    }
    return 1;
}